

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O3

int ovf::detail::write::segment<double>
              (ovf_file *file,ovf_segment *segment,double *vf,bool append,int format)

{
  uint n_cols;
  parser_state *this;
  pointer pbVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  undefined7 in_register_00000009;
  size_t sVar5;
  long lVar6;
  uint format_00;
  string *output_to_file;
  uint n_rows;
  ulong uVar7;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_string_view<char> format_str_18;
  basic_string_view<char> format_str_19;
  basic_string_view<char> format_str_20;
  basic_string_view<char> format_str_21;
  basic_string_view<char> format_str_22;
  basic_string_view<char> format_str_23;
  basic_string_view<char> format_str_24;
  basic_string_view<char> format_str_25;
  basic_string_view<char> format_str_26;
  basic_string_view<char> format_str_27;
  basic_string_view<char> format_str_28;
  basic_string_view<char> format_str_29;
  basic_string_view<char> format_str_30;
  basic_string_view<char> format_str_31;
  basic_string_view<char> format_str_32;
  basic_string_view<char> format_str_33;
  basic_string_view<char> format_str_34;
  basic_string_view<char> format_str_35;
  basic_string_view<char> format_str_36;
  basic_string_view<char> format_str_37;
  basic_string_view<char> format_str_38;
  basic_string_view<char> format_str_39;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string_view<char> format_str_40;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_15;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_16;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_17;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_18;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_19;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_20;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_21;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_22;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_23;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_24;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_25;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_26;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_27;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_28;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_29;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_30;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_31;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_32;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_33;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_34;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_35;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_36;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_37;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_38;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_39;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_40;
  string datatype_out;
  string meshtype;
  file_handle handle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  char *local_2e8 [2];
  char local_2d8 [24];
  ovf_file *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  char *pcStack_2b0;
  undefined1 local_2a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_260 [8];
  undefined1 *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [216];
  ios_base local_168 [288];
  double *local_48;
  undefined4 local_40;
  uint local_3c;
  allocator_type local_38 [8];
  
  local_40 = (undefined4)CONCAT71(in_register_00000009,append);
  this = file->_state;
  local_2c0 = file;
  local_260 = (undefined1  [8])&local_250;
  local_48 = vf;
  local_3c = format;
  if ((this->file_contents).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->file_contents).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start || !append) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               local_2c0->_state,local_260,local_240);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
  }
  if (local_260 != (undefined1  [8])&local_250) {
    operator_delete((void *)local_260);
  }
  pbVar1 = (local_2c0->_state->file_contents).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  output_to_file =
       (string *)
       ((long)&(pbVar1->_M_dataplus)._M_p +
       (((long)(local_2c0->_state->file_contents).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) * 0x8000000 + -0x100000000
       >> 0x1b));
  std::__cxx11::string::reserve((ulong)output_to_file);
  local_298._M_allocated_capacity = (ulong)(uint)local_298._M_allocated_capacity._4_4_ << 0x20;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str.size_ = DAT_00179758;
  format_str.data_ = empty_line_abi_cxx11_;
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str,args);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_00.size_ = 0x11;
  format_str_00.data_ = "# Begin: Segment\n";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_00,args_00);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_01.size_ = 0x10;
  format_str_01.data_ = "# Begin: Header\n";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_01,args_01);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_02.size_ = DAT_00179758;
  format_str_02.data_ = empty_line_abi_cxx11_;
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_02,args_02);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)segment->title;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_03.size_ = 0xc;
  format_str_03.data_ = "# Title: {}\n";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char*>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_03,args_03);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_04.size_ = DAT_00179758;
  format_str_04.data_ = empty_line_abi_cxx11_;
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_04,args_04);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)segment->comment;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_05.size_ = 0xb;
  format_str_05.data_ = "# Desc: {}\n";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char*>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_05,args_05);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_06.size_ = DAT_00179758;
  format_str_06.data_ = empty_line_abi_cxx11_;
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_06,args_06);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)(uint)segment->valuedim;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_07.size_ = 0x29;
  format_str_07.data_ = "# valuedim: {}   ## field dimensionality\n";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_07,args_07);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)local_260,segment->valueunits,(allocator *)&local_308);
  iVar4 = std::__cxx11::string::compare(local_260);
  if (local_260 != (undefined1  [8])&local_250) {
    operator_delete((void *)local_260);
  }
  if (iVar4 == 0) {
    std::__cxx11::string::append((char *)output_to_file);
    if (0 < segment->valuedim) {
      iVar4 = 0;
      do {
        std::__cxx11::string::append((char *)output_to_file);
        iVar4 = iVar4 + 1;
      } while (iVar4 < segment->valuedim);
    }
    std::__cxx11::string::append((char *)output_to_file);
  }
  else {
    local_298._M_allocated_capacity = (size_type)segment->valueunits;
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_08.size_ = 0x11;
    format_str_08.data_ = "# valueunits: {}\n";
    args_08.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)(local_2a8 + 0x10);
    args_08.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char*>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_08,args_08);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::string((string *)local_260,segment->valuelabels,(allocator *)&local_308);
  iVar4 = std::__cxx11::string::compare(local_260);
  if (local_260 != (undefined1  [8])&local_250) {
    operator_delete((void *)local_260);
  }
  if (iVar4 == 0) {
    std::__cxx11::string::append((char *)output_to_file);
    if (0 < segment->valuedim) {
      iVar4 = 0;
      do {
        std::__cxx11::string::append((char *)output_to_file);
        iVar4 = iVar4 + 1;
      } while (iVar4 < segment->valuedim);
    }
    std::__cxx11::string::append((char *)output_to_file);
  }
  else {
    local_298._M_allocated_capacity = (size_type)segment->valuelabels;
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_09.size_ = 0x12;
    format_str_09.data_ = "# valuelabels: {}\n";
    args_09.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)(local_2a8 + 0x10);
    args_09.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char*>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_09,args_09);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_10.size_ = DAT_00179758;
  format_str_10.data_ = empty_line_abi_cxx11_;
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_10,args_10);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_11.size_ = 0x3a;
  format_str_11.data_ = "## Fundamental mesh measurement unit. Treated as a label:\n";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_11,args_11);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)local_260,segment->meshunit,(allocator *)&local_308);
  iVar4 = std::__cxx11::string::compare(local_260);
  if (local_260 != (undefined1  [8])&local_250) {
    operator_delete((void *)local_260);
  }
  if (iVar4 == 0) {
    std::__cxx11::string::append((char *)output_to_file);
  }
  else {
    local_298._M_allocated_capacity = (size_type)segment->meshunit;
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_12.size_ = 0xf;
    format_str_12.data_ = "# meshunit: {}\n";
    args_12.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)(local_2a8 + 0x10);
    args_12.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char*>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_12,args_12);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_13.size_ = DAT_00179758;
  format_str_13.data_ = empty_line_abi_cxx11_;
  args_13.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_13.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_13,args_13);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)(double)segment->bounds_min[0];
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_14.size_ = 0xb;
  format_str_14.data_ = "# xmin: {}\n";
  args_14.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_14.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_14,args_14);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)(double)segment->bounds_min[1];
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_15.size_ = 0xb;
  format_str_15.data_ = "# ymin: {}\n";
  args_15.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_15.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_15,args_15);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)(double)segment->bounds_min[2];
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_16.size_ = 0xb;
  format_str_16.data_ = "# zmin: {}\n";
  args_16.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_16.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_16,args_16);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)(double)segment->bounds_max[0];
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_17.size_ = 0xb;
  format_str_17.data_ = "# xmax: {}\n";
  args_17.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_17.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_17,args_17);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)(double)segment->bounds_max[1];
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_18.size_ = 0xb;
  format_str_18.data_ = "# ymax: {}\n";
  args_18.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_18.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_18,args_18);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = (size_type)(double)segment->bounds_max[2];
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_19.size_ = 0xb;
  format_str_19.data_ = "# zmax: {}\n";
  args_19.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_19.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_19,args_19);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_298._M_allocated_capacity = local_298._M_allocated_capacity & 0xffffffff00000000;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_20.size_ = DAT_00179758;
  format_str_20.data_ = empty_line_abi_cxx11_;
  args_20.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)(local_2a8 + 0x10);
  args_20.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_20,args_20);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  std::__cxx11::string::string
            ((string *)(local_2a8 + 0x10),segment->meshtype,(allocator *)local_260);
  iVar4 = std::__cxx11::string::compare(local_2a8 + 0x10);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace((ulong)(local_2a8 + 0x10),0,(char *)local_298._8_8_,0x156b43);
  }
  local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_298._M_allocated_capacity;
  pcStack_2b0 = (char *)local_298._8_8_;
  local_250._M_allocated_capacity = 0;
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  local_250._8_8_ = 500;
  format_str_21.size_ = 0xf;
  format_str_21.data_ = "# meshtype: {}\n";
  args_21.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_2b8;
  args_21.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string>
       ::TYPES;
  local_258 = local_240;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)local_260,format_str_21,args_21);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  iVar4 = std::__cxx11::string::compare(local_2a8 + 0x10);
  if (iVar4 == 0) {
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (double)segment->origin[0];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_23.size_ = 0xc;
    format_str_23.data_ = "# xbase: {}\n";
    args_23.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_23.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_23,args_23);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (double)segment->origin[1];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_24.size_ = 0xc;
    format_str_24.data_ = "# ybase: {}\n";
    args_24.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_24.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_24,args_24);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (double)segment->origin[2];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_25.size_ = 0xc;
    format_str_25.data_ = "# zbase: {}\n";
    args_25.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_25.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_25,args_25);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (double)segment->step_size[0];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_26.size_ = 0x10;
    format_str_26.data_ = "# xstepsize: {}\n";
    args_26.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_26.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_26,args_26);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (double)segment->step_size[1];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_27.size_ = 0x10;
    format_str_27.data_ = "# ystepsize: {}\n";
    args_27.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_27.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_27,args_27);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (double)segment->step_size[2];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_28.size_ = 0x10;
    format_str_28.data_ = "# zstepsize: {}\n";
    args_28.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_28.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,float>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_28,args_28);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)(uint)segment->n_cells[0];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_29.size_ = 0xd;
    format_str_29.data_ = "# xnodes: {}\n";
    args_29.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_29.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_29,args_29);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)(uint)segment->n_cells[1];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_30.size_ = 0xd;
    format_str_30.data_ = "# ynodes: {}\n";
    args_30.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_30.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_30,args_30);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)(uint)segment->n_cells[2];
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_31.size_ = 0xd;
    format_str_31.data_ = "# znodes: {}\n";
    args_31.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_2b8;
    args_31.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_31,args_31);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    if (local_258 != local_240) {
      operator_delete(local_258);
    }
    std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    n_rows = segment->n_cells[1] * segment->n_cells[0] * segment->n_cells[2];
LAB_0013b908:
    n_cols = segment->valuedim;
    if (0 < (int)(n_cols * n_rows)) {
      local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)local_2b8 & 0xffffffff00000000);
      local_250._M_allocated_capacity = 0;
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      local_250._8_8_ = 500;
      format_str_33.size_ = DAT_00179758;
      format_str_33.data_ = empty_line_abi_cxx11_;
      args_33.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_2b8;
      args_33.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_258 = local_240;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)local_260,format_str_33,args_33);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      if (local_258 != local_240) {
        operator_delete(local_258);
      }
      std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)local_2b8 & 0xffffffff00000000);
      local_250._M_allocated_capacity = 0;
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      local_250._8_8_ = 500;
      format_str_34.size_ = 0xe;
      format_str_34.data_ = "# End: Header\n";
      args_34.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_2b8;
      args_34.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_258 = local_240;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)local_260,format_str_34,args_34);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      if (local_258 != local_240) {
        operator_delete(local_258);
      }
      std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((ulong)local_2b8 & 0xffffffff00000000);
      local_250._M_allocated_capacity = 0;
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      local_250._8_8_ = 500;
      format_str_35.size_ = DAT_00179758;
      format_str_35.data_ = empty_line_abi_cxx11_;
      args_35.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_2b8;
      args_35.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_258 = local_240;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)local_260,format_str_35,args_35);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      if (local_258 != local_240) {
        operator_delete(local_258);
      }
      std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      format_00 = 2;
      if (local_3c != 0) {
        format_00 = local_3c;
      }
      local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8);
      if (format_00 < 5) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_2b8,0,pcStack_2b0,(ulong)(&PTR_what_00178d20)[(int)format_00]);
      }
      local_278._M_allocated_capacity = (size_type)local_2b8;
      local_278._8_8_ = pcStack_2b0;
      local_250._M_allocated_capacity = 0;
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      local_250._8_8_ = 500;
      format_str_36.size_ = 0x11;
      format_str_36.data_ = "# Begin: Data {}\n";
      args_36.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)(local_288 + 0x10);
      args_36.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string>
           ::TYPES;
      local_258 = local_240;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)local_260,format_str_36,args_36);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      if (local_258 != local_240) {
        operator_delete(local_258);
      }
      std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if (format_00 - 1 < 2) {
        append_data_bin_to_string<double>(output_to_file,local_48,n_cols,n_rows,format_00);
LAB_0013bddd:
        local_278._M_allocated_capacity = (size_type)local_2b8;
        local_278._8_8_ = pcStack_2b0;
        local_250._M_allocated_capacity = 0;
        local_260 = (undefined1  [8])&PTR_grow_00178c20;
        local_250._8_8_ = 500;
        format_str_38.size_ = 0xf;
        format_str_38.data_ = "# End: Data {}\n";
        args_38.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)(local_288 + 0x10);
        args_38.types_ =
             fmt::v5::
             format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string>
             ::TYPES;
        local_258 = local_240;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)local_260,format_str_38,args_38);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
        local_260 = (undefined1  [8])&PTR_grow_00178c20;
        if (local_258 != local_240) {
          operator_delete(local_258);
        }
        std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        local_278._M_allocated_capacity = local_278._M_allocated_capacity & 0xffffffff00000000;
        local_250._M_allocated_capacity = 0;
        local_260 = (undefined1  [8])&PTR_grow_00178c20;
        local_250._8_8_ = 500;
        format_str_39.size_ = 0xf;
        format_str_39.data_ = "# End: Segment\n";
        args_39.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)(local_288 + 0x10);
        args_39.types_ =
             fmt::v5::
             format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
             ::TYPES;
        local_258 = local_240;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)local_260,format_str_39,args_39);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
        local_260 = (undefined1  [8])&PTR_grow_00178c20;
        if (local_258 != local_240) {
          operator_delete(local_258);
        }
        std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((char)local_40 == '\0') {
          std::__cxx11::string::string
                    ((string *)&local_308,local_2c0->file_name,(allocator *)(local_288 + 0x10));
          std::ofstream::ofstream(local_260);
          std::ofstream::open((string *)local_260,(_Ios_Openmode)&local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          local_2c0->n_segments = 0;
          local_2c0->version = 2;
          top_header_string_abi_cxx11_();
          local_2e8[0] = local_2d8;
          pcVar2 = (output_to_file->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2e8,pcVar2,pcVar2 + output_to_file->_M_string_length);
          __l_00._M_len = 2;
          __l_00._M_array = &local_308;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_288 + 0x10),__l_00,local_38);
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 != '\0') {
            if (local_278._8_8_ != local_278._M_allocated_capacity) {
              lVar6 = 8;
              uVar7 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_260,
                           *(char **)(local_278._M_allocated_capacity + lVar6 + -8),
                           *(long *)(local_278._M_allocated_capacity + lVar6));
                uVar7 = uVar7 + 1;
                lVar6 = lVar6 + 0x20;
              } while (uVar7 < (ulong)((long)(local_278._8_8_ - local_278._0_8_) >> 5));
            }
            std::ofstream::close();
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_288 + 0x10));
          lVar6 = 0;
          do {
            if (local_2d8 + lVar6 != *(char **)((long)local_2e8 + lVar6)) {
              operator_delete(*(char **)((long)local_2e8 + lVar6));
            }
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != -0x40);
          std::ofstream::close();
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_308,local_2c0->file_name,(allocator *)(local_288 + 0x10));
          std::ofstream::ofstream(local_260);
          std::ofstream::open((string *)local_260,(_Ios_Openmode)&local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          pcVar2 = (output_to_file->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_308,pcVar2,pcVar2 + output_to_file->_M_string_length);
          __l._M_len = 1;
          __l._M_array = &local_308;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_288 + 0x10),__l,local_38);
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 != '\0') {
            if (local_278._8_8_ != local_278._M_allocated_capacity) {
              lVar6 = 8;
              uVar7 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_260,
                           *(char **)(local_278._M_allocated_capacity + lVar6 + -8),
                           *(long *)(local_278._M_allocated_capacity + lVar6));
                uVar7 = uVar7 + 1;
                lVar6 = lVar6 + 0x20;
              } while (uVar7 < (ulong)((long)(local_278._8_8_ - local_278._0_8_) >> 5));
            }
            std::ofstream::close();
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_288 + 0x10));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          std::ofstream::close();
        }
        local_260 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_260 + (long)_VTT[-3]) = _setbuf;
        std::filebuf::~filebuf((filebuf *)&local_258);
        std::ios_base::~ios_base(local_168);
        local_2c0->found = true;
        local_2c0->is_ovf = true;
        iVar4 = increment_n_segments(local_2c0);
      }
      else {
        if (format_00 == 3) {
          local_260 = (undefined1  [8])&local_250;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
          append_data_txt_to_string<double>
                    (output_to_file,local_48,n_cols,n_rows,(string *)local_260);
LAB_0013bdc3:
          if (local_260 != (undefined1  [8])&local_250) {
            operator_delete((void *)local_260);
          }
          goto LAB_0013bddd;
        }
        if (format_00 == 4) {
          local_260 = (undefined1  [8])&local_250;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_260,",","");
          append_data_txt_to_string<double>
                    (output_to_file,local_48,n_cols,n_rows,(string *)local_260);
          goto LAB_0013bdc3;
        }
        local_278._M_allocated_capacity = (size_type)format_00;
        sVar5 = 0xffffffffffffffff;
        do {
          lVar6 = sVar5 + 1;
          sVar5 = sVar5 + 1;
        } while ("write_segment not writing out any data, because format \"{}\" is invalid. You may want to check what you passed in."
                 [lVar6] != '\0');
        local_250._M_allocated_capacity = 0;
        local_260 = (undefined1  [8])&PTR_grow_00178c20;
        local_250._8_8_ = 500;
        format_str_40.size_ = sVar5;
        format_str_40.data_ =
             "write_segment not writing out any data, because format \"{}\" is invalid. You may want to check what you passed in."
        ;
        args_40.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)(local_288 + 0x10);
        args_40.types_ =
             fmt::v5::
             format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
             ::TYPES;
        local_258 = local_240;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)local_260,format_str_40,args_40);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
        local_260 = (undefined1  [8])&PTR_grow_00178c20;
        if (local_258 != local_240) {
          operator_delete(local_258);
        }
        std::__cxx11::string::operator=
                  ((string *)&local_2c0->_state->message_latest,(string *)&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        iVar4 = -2;
      }
      if (local_2b8 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8) {
        operator_delete(local_2b8);
      }
      goto LAB_0013c2f2;
    }
    local_308.field_2._M_allocated_capacity = (size_type)n_rows;
    local_2e8[0] = local_2c0->file_name;
    sVar5 = 0xffffffffffffffff;
    do {
      lVar6 = sVar5 + 1;
      sVar5 = sVar5 + 1;
    } while ("write_segment not writing out any data, because n_cols*n_rows={}*{}<=0 for file \"{}\". You may want to check the segment you passed in."
             [lVar6] != '\0');
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_37.size_ = sVar5;
    format_str_37.data_ =
         "write_segment not writing out any data, because n_cols*n_rows={}*{}<=0 for file \"{}\". You may want to check the segment you passed in."
    ;
    args_37.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_308;
    args_37.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int,char_const*>
         ::TYPES;
    local_308._M_dataplus._M_p = (pointer)(ulong)n_cols;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_37,args_37);
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,local_258,local_258 + local_250._M_allocated_capacity);
  }
  else {
    std::__cxx11::string::string((string *)local_260,segment->meshtype,(allocator *)&local_308);
    iVar4 = std::__cxx11::string::compare(local_260);
    if (local_260 != (undefined1  [8])&local_250) {
      operator_delete((void *)local_260);
    }
    if (iVar4 == 0) {
      local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(uint)segment->pointcount;
      local_250._M_allocated_capacity = 0;
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      local_250._8_8_ = 500;
      format_str_32.size_ = 0x11;
      format_str_32.data_ = "# pointcount: {}\n";
      args_32.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_2b8;
      args_32.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_258 = local_240;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)local_260,format_str_32,args_32);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,local_258,local_258 + local_250._M_allocated_capacity);
      local_260 = (undefined1  [8])&PTR_grow_00178c20;
      if (local_258 != local_240) {
        operator_delete(local_258);
      }
      std::__cxx11::string::_M_append((char *)output_to_file,(ulong)local_308._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      n_rows = segment->pointcount;
      goto LAB_0013b908;
    }
    local_308._M_dataplus._M_p = local_2c0->file_name;
    local_308.field_2._M_allocated_capacity = (size_type)segment->meshtype;
    sVar5 = 0xffffffffffffffff;
    do {
      lVar6 = sVar5 + 1;
      sVar5 = sVar5 + 1;
    } while ("write_segment not writing out any data to file \"{}\", because meshtype is invalid: \"{}\". You may want to check the segment you passed in."
             [lVar6] != '\0');
    local_250._M_allocated_capacity = 0;
    local_260 = (undefined1  [8])&PTR_grow_00178c20;
    local_250._8_8_ = 500;
    format_str_22.size_ = sVar5;
    format_str_22.data_ =
         "write_segment not writing out any data to file \"{}\", because meshtype is invalid: \"{}\". You may want to check the segment you passed in."
    ;
    args_22.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_308;
    args_22.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*,char*>
         ::TYPES;
    local_258 = local_240;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_260,format_str_22,args_22);
    local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,local_258,local_258 + local_250._M_allocated_capacity);
  }
  local_260 = (undefined1  [8])&PTR_grow_00178c20;
  if (local_258 != local_240) {
    operator_delete(local_258);
  }
  std::__cxx11::string::operator=((string *)&local_2c0->_state->message_latest,(string *)&local_2b8)
  ;
  if (local_2b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8) {
    operator_delete(local_2b8);
  }
  iVar4 = -2;
LAB_0013c2f2:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_298._M_allocated_capacity !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288) {
    operator_delete((void *)local_298._M_allocated_capacity);
  }
  return iVar4;
}

Assistant:

int segment( ovf_file *file, const ovf_segment * segment, const T * vf,
                const bool append = false, int format = OVF_FORMAT_BIN8 )
    try
    {
        if( file->_state->file_contents.size() > 0 && append )
            file->_state->file_contents.push_back("");
        else
            file->_state->file_contents = {""};

        int index = file->_state->file_contents.size()-1;
        std::string & output_to_file = file->_state->file_contents[index];
        output_to_file.reserve( int( 0x08000000 ) );  // reserve 128[MByte]

        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# Begin: Segment\n" );
        output_to_file += fmt::format( "# Begin: Header\n" );
        output_to_file += fmt::format( empty_line );

        output_to_file += fmt::format( "# Title: {}\n", segment->title );
        output_to_file += fmt::format( empty_line );

        output_to_file += fmt::format( "# Desc: {}\n", segment->comment );
        output_to_file += fmt::format( empty_line );

        // The value dimension is always 3 since we are writting Vector3-data
        output_to_file += fmt::format( "# valuedim: {}   ## field dimensionality\n", segment->valuedim );

        //
        if( std::string(segment->valueunits) == "" )
        {
            output_to_file += "# valueunits: ";
            for( int i=0; i<segment->valuedim; ++i )
                output_to_file += " unspecified";
            output_to_file += "\n";
        }
        else
            output_to_file += fmt::format( "# valueunits: {}\n", segment->valueunits );

        //
        if( std::string(segment->valuelabels) == "" )
        {
            output_to_file += "# valuelabels: ";
            for( int i=0; i<segment->valuedim; ++i )
                output_to_file += " unspecified";
            output_to_file += "\n";
        }
        else
            output_to_file += fmt::format( "# valuelabels: {}\n", segment->valuelabels );

        // spatial unit
        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "## Fundamental mesh measurement unit. Treated as a label:\n" );
        if( std::string(segment->meshunit) == "" )
            output_to_file += "# meshunit: unspecified\n";
        else
            output_to_file += fmt::format( "# meshunit: {}\n", segment->meshunit );

        // extent
        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# xmin: {}\n", segment->bounds_min[0] );
        output_to_file += fmt::format( "# ymin: {}\n", segment->bounds_min[1] );
        output_to_file += fmt::format( "# zmin: {}\n", segment->bounds_min[2] );
        output_to_file += fmt::format( "# xmax: {}\n", segment->bounds_max[0] );
        output_to_file += fmt::format( "# ymax: {}\n", segment->bounds_max[1] );
        output_to_file += fmt::format( "# zmax: {}\n", segment->bounds_max[2] );
        output_to_file += fmt::format( empty_line );

        // Type of mesh and further keywords depending on it
        std::string meshtype = segment->meshtype;
        if( meshtype == "" )
            meshtype = "rectangular";
        output_to_file += fmt::format( "# meshtype: {}\n", meshtype );

        int n_rows = 0;
        if( meshtype == "rectangular" )
        {
            // Latice origin in space
            output_to_file += fmt::format( "# xbase: {}\n", segment->origin[0] );
            output_to_file += fmt::format( "# ybase: {}\n", segment->origin[1] );
            output_to_file += fmt::format( "# zbase: {}\n", segment->origin[2] );

            // Mesh spacing
            output_to_file += fmt::format( "# xstepsize: {}\n", segment->step_size[0] );
            output_to_file += fmt::format( "# ystepsize: {}\n", segment->step_size[1] );
            output_to_file += fmt::format( "# zstepsize: {}\n", segment->step_size[2] );

            // Number of nodes along each direction
            output_to_file += fmt::format( "# xnodes: {}\n", segment->n_cells[0] );
            output_to_file += fmt::format( "# ynodes: {}\n", segment->n_cells[1] );
            output_to_file += fmt::format( "# znodes: {}\n", segment->n_cells[2] );

            n_rows = segment->n_cells[0]*segment->n_cells[1]*segment->n_cells[2];
        }
        else if( std::string(segment->meshtype) == "irregular" )
        {
            output_to_file += fmt::format( "# pointcount: {}\n", segment->pointcount );
            n_rows = segment->pointcount;
        }
        else
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data to file \"{}\", because meshtype is invalid: \"{}\". "
                "You may want to check the segment you passed in.",
                file->file_name, segment->meshtype);
            return OVF_ERROR;
        }

        int n_cols = segment->valuedim;

        // Check that we actually read in any data
        if( n_cols*n_rows <= 0 )
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data, because n_cols*n_rows={}*{}<=0 for file \"{}\". "
                "You may want to check the segment you passed in.",
                n_cols, n_rows, file->file_name);
            return OVF_ERROR;
        }

        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# End: Header\n" );
        output_to_file += fmt::format( empty_line );

        if( sizeof(T) == sizeof(float) && format == OVF_FORMAT_BIN )
            format = OVF_FORMAT_BIN4;
        else if( sizeof(T) == sizeof(double) && format == OVF_FORMAT_BIN )
            format = OVF_FORMAT_BIN8;

        std::string datatype_out = "";
        if ( format == OVF_FORMAT_BIN8 )
            datatype_out = "Binary 8";
        else if ( format == OVF_FORMAT_BIN4 )
            datatype_out = "Binary 4";
        else if( format == OVF_FORMAT_TEXT )
            datatype_out = "Text";
        else if( format == OVF_FORMAT_CSV )
            datatype_out = "CSV";

        // Data
        output_to_file += fmt::format( "# Begin: Data {}\n", datatype_out );

        if ( format == OVF_FORMAT_BIN || format == OVF_FORMAT_BIN8 || format == OVF_FORMAT_BIN4 )
            append_data_bin_to_string( output_to_file, vf, n_cols, n_rows, format );
        else if ( format == OVF_FORMAT_TEXT )
            append_data_txt_to_string( output_to_file, vf, n_cols, n_rows );
        else if ( format == OVF_FORMAT_CSV )
            append_data_txt_to_string( output_to_file, vf, n_cols, n_rows, "," );
        else
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data, because format \"{}\" is invalid. "
                "You may want to check what you passed in.", format);
            return OVF_ERROR;
        }
        output_to_file += fmt::format( "# End: Data {}\n", datatype_out );
        output_to_file += fmt::format( "# End: Segment\n" );

        // Append the #End keywords
        if( append )
        {
            file_handle handle(file->file_name, true);
            handle.write( {output_to_file} );
        }
        else
        {
            file_handle handle(file->file_name, false);
            file->n_segments = 0;
            file->version = 2;
            handle.write( {top_header_string(), output_to_file} );
        }
        file->found  = true;
        file->is_ovf = true;

        // Increment the n_segments after succesfully appending the segment body to the file
        return increment_n_segments(file);
    }
    catch( const std::exception & ex )
    {
        file->_state->message_latest = fmt::format("Caught std::exception \"{}\"", ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        return OVF_ERROR;
    }